

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::detail::
do_assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db,
          key_type key,value_view expected,char *file,int line)

{
  bool bVar1;
  __extent_storage<18446744073709551615UL> message;
  value_view expected_00;
  AssertHelper local_208;
  Message local_200;
  undefined1 local_1f8 [8];
  get_result result;
  ScopedTrace local_1bd [8];
  ScopedTrace trace;
  ostringstream local_1b0 [8];
  ostringstream msg;
  int line_local;
  char *file_local;
  key_type key_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_local;
  value_view expected_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  unodb::detail::dump_key<unsigned_long>((ostream *)local_1b0,(unsigned_long)db);
  std::__cxx11::ostringstream::str();
  message._M_extent_value =
       (size_t)&result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>.
                _M_payload.
                super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
                super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged;
  testing::ScopedTrace::ScopedTrace
            (local_1bd,(char *)expected._M_extent._M_extent_value._M_extent_value,(int)file,
             (string *)message._M_extent_value);
  std::__cxx11::string::~string
            ((string *)
             &result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>.
              _M_payload.
              super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
              super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_engaged);
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get
            ((get_result *)local_1f8,
             (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,
             (unsigned_long)db);
  bVar1 = olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::key_found
                    ((get_result_conflict *)local_1f8);
  if (bVar1) {
    expected_00._M_extent._M_extent_value = message._M_extent_value;
    expected_00._M_ptr = expected._M_ptr;
    assert_value_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((detail *)local_1f8,(get_result *)key,expected_00);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"db.get did not find ");
    unodb::detail::dump_key<unsigned_long>((ostream *)&std::cerr,(unsigned_long)db);
    std::operator<<((ostream *)&std::cerr,'\n');
    olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
              ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,
               (ostream *)&std::cerr);
    testing::Message::Message(&local_200);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x80,"Failed");
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message(&local_200);
  }
  std::optional<unodb::qsbr_ptr_span<const_std::byte>_>::~optional
            ((optional<unodb::qsbr_ptr_span<const_std::byte>_> *)local_1f8);
  testing::ScopedTrace::~ScopedTrace(local_1bd);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return;
}

Assistant:

void do_assert_result_eq(const Db &db, typename Db::key_type key,
                         unodb::value_view expected, const char *file,
                         int line) {
  std::ostringstream msg;
  unodb::detail::dump_key(msg, key);
  const testing::ScopedTrace trace(file, line, msg.str());
  const auto result = db.get(key);
  if (!Db::key_found(result)) {
    // LCOV_EXCL_START
    std::cerr << "db.get did not find ";
    unodb::detail::dump_key(std::cerr, key);
    std::cerr << '\n';
    db.dump(std::cerr);
    FAIL();
    // LCOV_EXCL_STOP
  }
  assert_value_eq<Db>(result, expected);
}